

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time.cc
# Opt level: O0

bool __thiscall
absl::lts_20240722::ParseLenientCivilTime(lts_20240722 *this,string_view s,CivilHour *c)

{
  string_view s_00;
  bool bVar1;
  CivilHour *c_local;
  string_view s_local;
  
  s_00._M_str = (char *)s._M_len;
  s_00._M_len = (size_t)this;
  bVar1 = (anonymous_namespace)::
          ParseLenient<absl::lts_20240722::time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::hour_tag>>
                    (s_00,(civil_time<absl::lts_20240722::time_internal::hour_tag> *)s._M_str);
  return bVar1;
}

Assistant:

bool ParseLenientCivilTime(string_view s, CivilHour* c) {
  return ParseLenient(s, c);
}